

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool __thiscall
duckdb::TryCastErrorMessage::Operation<duckdb::string_t,duckdb::dtime_t>
          (TryCastErrorMessage *this,string_t input,dtime_t *result,CastParameters *parameters)

{
  bool bVar1;
  char *buf;
  idx_t pos;
  _Alloc_hider local_50;
  char *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffffc0;
  idx_t local_30;
  
  local_48 = input.value._0_8_;
  buf = (char *)((long)&local_50._M_p + 4);
  if (0xc < (uint)this) {
    buf = local_48;
  }
  local_50._M_p = (pointer)this;
  bVar1 = Time::TryConvertTime
                    (buf,(ulong)this & 0xffffffff,&local_30,input.value._8_8_,
                     SUB81(result[1].micros,0),(optional_ptr<int,_true>)0x0);
  if (!bVar1) {
    Time::ConversionError_abi_cxx11_((string_t)in_stack_ffffffffffffffc0);
    HandleCastError::AssignError((string *)&local_50,(CastParameters *)result);
    if ((TryCastErrorMessage *)local_50._M_p != (TryCastErrorMessage *)&stack0xffffffffffffffc0) {
      operator_delete(local_50._M_p);
    }
  }
  return bVar1;
}

Assistant:

bool TryCastErrorMessage::Operation(string_t input, dtime_t &result, CastParameters &parameters) {
	if (!TryCast::Operation<string_t, dtime_t>(input, result, parameters.strict)) {
		HandleCastError::AssignError(Time::ConversionError(input), parameters);
		return false;
	}
	return true;
}